

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

bool duckdb::CheckIfParamIsEmpty
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *param
               )

{
  LogicalTypeId LVar1;
  int iVar2;
  pointer pEVar3;
  BoundConstantExpression *this;
  type pBVar4;
  BinderException *this_00;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_e0;
  vector<duckdb::Value,_true> local_d8;
  LogicalType local_b8;
  Value local_a0;
  Value local_60;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (param);
  LVar1 = (pEVar3->return_type).id_;
  if (LVar1 == LIST) {
    LogicalType::LogicalType(&local_b8,INTEGER);
    local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::LIST(&local_60,&local_b8,&local_d8);
    this = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_a0,&local_60);
    BoundConstantExpression::BoundConstantExpression(this,&local_a0);
    local_e0._M_head_impl = this;
    Value::~Value(&local_a0);
    Value::~Value(&local_60);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
    LogicalType::~LogicalType(&local_b8);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(param);
    pBVar4 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
             ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                          *)&local_e0);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[10])(pEVar3,pBVar4);
    if ((char)iVar2 == '\0') {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_a0.type_._0_8_ = (long)&local_a0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"The upper and lower bounds of the slice must be a BIGINT","");
      BinderException::BinderException(this_00,(string *)&local_a0);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_e0._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_e0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
  }
  return LVar1 == LIST;
}

Assistant:

static bool CheckIfParamIsEmpty(duckdb::unique_ptr<duckdb::Expression> &param) {
	bool is_empty = false;
	if (param->return_type.id() == LogicalTypeId::LIST) {
		auto empty_list = make_uniq<BoundConstantExpression>(Value::LIST(LogicalType::INTEGER, vector<Value>()));
		is_empty = param->Equals(*empty_list);
		if (!is_empty) {
			// if the param is not empty, the user has entered a list instead of a BIGINT
			throw BinderException("The upper and lower bounds of the slice must be a BIGINT");
		}
	}
	return is_empty;
}